

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathFreeValueTree(xmlNodeSetPtr obj)

{
  int local_14;
  int i;
  xmlNodeSetPtr obj_local;
  
  if (obj != (xmlNodeSetPtr)0x0) {
    if (obj->nodeTab != (xmlNodePtr *)0x0) {
      for (local_14 = 0; local_14 < obj->nodeNr; local_14 = local_14 + 1) {
        if (obj->nodeTab[local_14] != (xmlNodePtr)0x0) {
          if (obj->nodeTab[local_14]->type == XML_NAMESPACE_DECL) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)obj->nodeTab[local_14]);
          }
          else {
            xmlFreeNodeList(obj->nodeTab[local_14]);
          }
        }
      }
      (*xmlFree)(obj->nodeTab);
    }
    (*xmlFree)(obj);
  }
  return;
}

Assistant:

static void
xmlXPathFreeValueTree(xmlNodeSetPtr obj) {
    int i;

    if (obj == NULL) return;

    if (obj->nodeTab != NULL) {
	for (i = 0;i < obj->nodeNr;i++) {
	    if (obj->nodeTab[i] != NULL) {
		if (obj->nodeTab[i]->type == XML_NAMESPACE_DECL) {
		    xmlXPathNodeSetFreeNs((xmlNsPtr) obj->nodeTab[i]);
		} else {
		    xmlFreeNodeList(obj->nodeTab[i]);
		}
	    }
	}
	xmlFree(obj->nodeTab);
    }
    xmlFree(obj);
}